

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.cpp
# Opt level: O2

BindingMode __thiscall duckdb::Binder::GetBindingMode(Binder *this)

{
  Binder *pBVar1;
  
  pBVar1 = GetRootBinder(this);
  return pBVar1->mode;
}

Assistant:

BindingMode Binder::GetBindingMode() {
	auto &root_binder = GetRootBinder();
	return root_binder.mode;
}